

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::CopyAELToSEL(Clipper *this)

{
  TEdge *pTVar1;
  
  pTVar1 = this->m_ActiveEdges;
  this->m_SortedEdges = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->prevInSEL = (TEdge *)0x0;
    while (pTVar1 = pTVar1->nextInAEL, pTVar1 != (TEdge *)0x0) {
      pTVar1->prevInSEL = pTVar1->prevInAEL;
      pTVar1->prevInAEL->nextInSEL = pTVar1;
      pTVar1->nextInSEL = (TEdge *)0x0;
    }
  }
  return;
}

Assistant:

void Clipper::CopyAELToSEL()
{
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  if (!m_ActiveEdges) return;
  m_SortedEdges->prevInSEL = 0;
  e = e->nextInAEL;
  while ( e )
  {
    e->prevInSEL = e->prevInAEL;
    e->prevInSEL->nextInSEL = e;
    e->nextInSEL = 0;
    e = e->nextInAEL;
  }
}